

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_named_node_iterator * __thiscall
pugi::xml_named_node_iterator::operator--(xml_named_node_iterator *this)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node xVar3;
  char *src;
  
  if ((this->_wrap)._root != (xml_node_struct *)0x0) goto LAB_00127c57;
  pxVar1 = (this->_parent)._root;
  if ((pxVar1 == (xml_node_struct *)0x0) ||
     (pxVar1 = pxVar1->first_child, pxVar1 == (xml_node_struct *)0x0)) {
    (this->_wrap)._root = (xml_node_struct *)0x0;
LAB_00127c43:
    src = "";
  }
  else {
    pxVar1 = pxVar1->prev_sibling_c;
    (this->_wrap)._root = pxVar1;
    if (pxVar1 == (xml_node_struct *)0x0) goto LAB_00127c43;
    src = "";
    if (pxVar1->name != (char_t *)0x0) {
      src = pxVar1->name;
    }
  }
  bVar2 = impl::anon_unknown_0::strequal(src,this->_name);
  if (bVar2) {
    return this;
  }
LAB_00127c57:
  xVar3 = xml_node::previous_sibling(&this->_wrap,this->_name);
  (this->_wrap)._root = xVar3._root;
  return this;
}

Assistant:

PUGI__FN const xml_named_node_iterator& xml_named_node_iterator::operator--()
	{
		if (_wrap._root)
			_wrap = _wrap.previous_sibling(_name);
		else
		{
			_wrap = _parent.last_child();

			if (!impl::strequal(_wrap.name(), _name))
				_wrap = _wrap.previous_sibling(_name);
		}

		return *this;
	}